

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ushort uVar9;
  ulong uVar10;
  U16 symbolNext [53];
  
  bVar1 = (byte)tableLog;
  uVar5 = 1;
  uVar2 = 1 << (bVar1 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6236,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6237,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  uVar6 = (uint)(0x8000 << (bVar1 & 0x1f)) >> 0x10;
  uVar4 = uVar2 - 1;
  for (uVar8 = 0; maxSymbolValue + 1 != uVar8; uVar8 = uVar8 + 1) {
    uVar9 = normalizedCounter[uVar8];
    if (uVar9 == 0xffff) {
      uVar10 = (ulong)uVar4;
      uVar4 = uVar4 - 1;
      dt[uVar10 + 1].baseValue = (U32)uVar8;
      uVar9 = 1;
    }
    else {
      if ((short)uVar9 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6245,
                      "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                     );
      }
      if (uVar6 < uVar9 || uVar6 == uVar9) {
        uVar5 = 0;
      }
    }
    symbolNext[uVar8] = uVar9;
  }
  dt->nextState = (short)uVar5;
  dt->nbAdditionalBits = (char)((uint)uVar5 >> 0x10);
  dt->nbBits = (char)((uint)uVar5 >> 0x18);
  dt->baseValue = tableLog;
  uVar6 = 0;
  for (uVar8 = 0; uVar8 != maxSymbolValue + 1; uVar8 = uVar8 + 1) {
    uVar9 = normalizedCounter[uVar8];
    uVar7 = 0;
    if ((short)uVar9 < 1) {
      uVar9 = 0;
    }
    for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
      dt[(ulong)uVar6 + 1].baseValue = (U32)uVar8;
      do {
        uVar6 = uVar6 + (uVar2 >> 1) + (uVar2 >> 3) + 3 & uVar2 - 1;
      } while (uVar4 < uVar6);
    }
  }
  if (uVar6 != 0) {
    __assert_fail("position == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6256,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  uVar8 = 0;
  while( true ) {
    if (uVar2 == uVar8) {
      return;
    }
    uVar4 = dt[uVar8 + 1].baseValue;
    uVar9 = symbolNext[uVar4];
    symbolNext[uVar4] = uVar9 + 1;
    uVar6 = BIT_highbit32((uint)uVar9);
    bVar3 = bVar1 - (char)uVar6;
    dt[uVar8 + 1].nbBits = bVar3;
    dt[uVar8 + 1].nextState = (uVar9 << (bVar3 & 0x1f)) - (short)uVar2;
    if (0xfe < nbAdditionalBits[uVar4]) break;
    dt[uVar8 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar4];
    dt[uVar8 + 1].baseValue = baseValue[uVar4];
    uVar8 = uVar8 + 1;
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x6260,
                "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
               );
}

Assistant:

void
ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U16 symbolNext[MaxSeq+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);

    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    assert(normalizedCounter[s]>=0);
                    symbolNext[s] = (U16)normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = (BYTE)nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
    }   }
}